

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyleExtra::SetDefaults(ON_DimStyleExtra *this)

{
  bool bVar1;
  int iVar2;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar3;
  bool *pbVar4;
  double dVar5;
  int local_18;
  int i;
  ON_DimStyleExtra *this_local;
  
  iVar2 = ON_V5x_DimStyle::DefaultToleranceStyle();
  this->m_tolerance_style = iVar2;
  iVar2 = ON_V5x_DimStyle::DefaultToleranceResolution();
  this->m_tolerance_resolution = iVar2;
  dVar5 = ON_V5x_DimStyle::DefaultToleranceUpperValue();
  this->m_tolerance_upper_value = dVar5;
  dVar5 = ON_V5x_DimStyle::DefaultToleranceLowerValue();
  this->m_tolerance_lower_value = dVar5;
  dVar5 = ON_V5x_DimStyle::DefaultToleranceHeightScale();
  this->m_tolerance_height_scale = dVar5;
  dVar5 = ON_V5x_DimStyle::DefaultBaselineSpacing();
  this->m_baseline_spacing = dVar5;
  bVar1 = ON_V5x_DimStyle::DefaultDrawTextMask();
  this->m_bDrawMask = bVar1;
  iVar2 = ON_V5x_DimStyle::DefaultMaskColorSource();
  this->m_mask_color_source = iVar2;
  aVar3 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_V5x_DimStyle::DefaultMaskColor();
  (this->m_mask_color).field_0 = aVar3;
  dVar5 = ON_V5x_DimStyle::DefaultDimScale();
  this->m_dimscale = dVar5;
  iVar2 = ON_V5x_DimStyle::DefaultDimScaleSource();
  this->m_dimscale_source = iVar2;
  local_18 = 0;
  while( true ) {
    iVar2 = ON_SimpleArray<bool>::Count(&this->m_valid_fields);
    if (iVar2 <= local_18) break;
    pbVar4 = ON_SimpleArray<bool>::operator[](&this->m_valid_fields,local_18);
    *pbVar4 = false;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void ON_DimStyleExtra::SetDefaults()
{
  m_tolerance_style = ON_V5x_DimStyle::DefaultToleranceStyle();
  m_tolerance_resolution = ON_V5x_DimStyle::DefaultToleranceResolution();
  m_tolerance_upper_value = ON_V5x_DimStyle::DefaultToleranceUpperValue();
  m_tolerance_lower_value = ON_V5x_DimStyle::DefaultToleranceLowerValue();
  m_tolerance_height_scale = ON_V5x_DimStyle::DefaultToleranceHeightScale();
  m_baseline_spacing = ON_V5x_DimStyle::DefaultBaselineSpacing();
  m_bDrawMask = ON_V5x_DimStyle::DefaultDrawTextMask(); // false;
  m_mask_color_source = ON_V5x_DimStyle::DefaultMaskColorSource(); // 0;
  m_mask_color = ON_V5x_DimStyle::DefaultMaskColor(); // .SetRGB(255,255,255);
  m_dimscale = ON_V5x_DimStyle::DefaultDimScale(); // 1.0;
  m_dimscale_source = ON_V5x_DimStyle::DefaultDimScaleSource(); // 0;

  for( int i = 0; i < m_valid_fields.Count(); i++)
    m_valid_fields[i] = false;
}